

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdSetIssueAsset(void *handle,void *create_handle,char *txid,uint32_t vout,char *contract_hash,
                    int64_t asset_amount,char *asset_address,char *asset_locking_script,
                    int64_t token_amount,char *token_address,char *token_locking_script,
                    bool is_blind_asset,char **entropy,char **asset_string,char **token_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  ConfidentialTransactionContext *this;
  pointer puVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  CfdException *pCVar9;
  bool is_bitcoin;
  allocator local_b29;
  string local_b28;
  void *local_b08;
  char *local_b00;
  char *work_asset;
  char *work_entropy;
  ByteData256 local_ae8;
  int64_t local_ad0;
  undefined8 local_ac8;
  OutPoint outpoint;
  IssuanceOutputParameter issuance_data;
  IssuanceParameter data;
  ElementsConfidentialAddress local_5a8;
  Script local_3f8;
  int64_t local_3c0;
  bool bStack_3b8;
  undefined7 uStack_3b7;
  bool local_3b0;
  IssuanceOutputParameter token_data;
  
  work_entropy = (char *)0x0;
  work_asset = (char *)0x0;
  local_ac8 = 0;
  local_b08 = handle;
  local_b00 = contract_hash;
  local_ad0 = asset_amount;
  cfd::Initialize();
  psVar2 = &issuance_data.address.address_;
  issuance_data.address._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&issuance_data,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)&issuance_data);
  if ((string *)issuance_data.address._0_8_ != psVar2) {
    operator_delete((void *)issuance_data.address._0_8_);
  }
  if (entropy == (char **)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xac7;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&issuance_data,kCfdLogLevelWarning,"entropy is null.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    issuance_data.address._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&issuance_data,"Failed to parameter. entropy is null.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (txid == (char *)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xacd;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&issuance_data,kCfdLogLevelWarning,"txid is null.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    issuance_data.address._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&issuance_data,"Failed to parameter. txid is null.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (asset_string == (char **)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xad3;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&issuance_data,kCfdLogLevelWarning,"asset_string is null.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    issuance_data.address._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&issuance_data,"Failed to parameter. asset_string is null.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (token_string == (char **)0x0 && 0 < token_amount) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xad9;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&issuance_data,kCfdLogLevelWarning,"token_string is null.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    issuance_data.address._0_8_ = &issuance_data.address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&issuance_data,"Failed to parameter. token_string is null.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (asset_address == (char *)0x0 && asset_locking_script == (char *)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xadf;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&issuance_data,kCfdLogLevelWarning,
               "asset address and script is null.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    issuance_data.address._0_8_ = &issuance_data.address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&issuance_data,"Failed to parameter. asset address and script is null.","")
    ;
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (((0 < token_amount) && (token_address == (char *)0x0)) &&
     (token_locking_script == (char *)0x0)) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xae6;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&issuance_data,kCfdLogLevelWarning,
               "token address and script is null.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    issuance_data.address._0_8_ = &issuance_data.address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&issuance_data,"Failed to parameter. token address and script is null.","")
    ;
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
  if (this == (ConfidentialTransactionContext *)0x0) {
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    issuance_data.address._0_8_ = &issuance_data.address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&issuance_data,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalStateError,(string *)&issuance_data);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin != true) {
    psVar2 = &token_data.address.address_;
    token_data.address._0_8_ = psVar2;
    sVar5 = strlen(txid);
    std::__cxx11::string::_M_construct<char_const*>((string *)&token_data,txid,txid + sVar5);
    cfd::core::Txid::Txid((Txid *)&issuance_data,(string *)&token_data);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&issuance_data,vout);
    issuance_data.address._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT44(issuance_data.address._12_4_,issuance_data.address.witness_ver_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(issuance_data.address._12_4_,
                                       issuance_data.address.witness_ver_));
    }
    if ((string *)token_data.address._0_8_ != psVar2) {
      operator_delete((void *)token_data.address._0_8_);
    }
    cfd::capi::ConvertToIssuanceParameter(&issuance_data,asset_address,asset_locking_script);
    cfd::core::Amount::Amount((Amount *)&token_data,local_ad0);
    issuance_data.amount.ignore_check_ = (bool)(undefined1)token_data.address.witness_ver_;
    issuance_data.amount.amount_._0_4_ = token_data.address.type_;
    issuance_data.amount.amount_._4_4_ = token_data.address.addr_type_;
    cfd::core::Address::Address(&token_data.address);
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
              (&token_data.confidential_address);
    cfd::core::Script::Script(&token_data.direct_locking_script);
    cfd::core::Amount::Amount(&token_data.amount);
    token_data.is_remove_nonce = false;
    if (0 < token_amount) {
      cfd::capi::ConvertToIssuanceParameter
                ((IssuanceOutputParameter *)&data,token_address,token_locking_script);
      cfd::core::Address::operator=(&token_data.address,(Address *)&data);
      cfd::core::ElementsConfidentialAddress::operator=(&token_data.confidential_address,&local_5a8)
      ;
      cfd::core::Script::operator=(&token_data.direct_locking_script,&local_3f8);
      token_data.is_remove_nonce = local_3b0;
      token_data.amount.amount_ = local_3c0;
      token_data.amount.ignore_check_ = bStack_3b8;
      token_data.amount._9_7_ = uStack_3b7;
      cfd::IssuanceOutputParameter::~IssuanceOutputParameter((IssuanceOutputParameter *)&data);
      cfd::core::Amount::Amount((Amount *)&data,token_amount);
      token_data.amount.ignore_check_ =
           (bool)data.entropy.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_1_;
      token_data.amount.amount_ = (int64_t)data.entropy._vptr_BlindFactor;
    }
    cfd::core::ByteData256::ByteData256(&local_ae8);
    bVar4 = cfd::capi::IsEmptyString(local_b00);
    if (!bVar4) {
      std::__cxx11::string::string((string *)&data,local_b00,&local_b29);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_b28,(string *)&data);
      puVar3 = local_ae8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_ae8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_b28._M_dataplus._M_p;
      local_ae8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_b28._M_string_length;
      local_ae8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_b28.field_2._M_allocated_capacity;
      local_b28._M_dataplus._M_p = (pointer)0x0;
      local_b28._M_string_length = 0;
      local_b28.field_2._M_allocated_capacity = 0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        if ((pointer)local_b28._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_b28._M_dataplus._M_p);
        }
      }
      if (data.entropy._vptr_BlindFactor !=
          (_func_int **)
          ((long)&data.entropy.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(data.entropy._vptr_BlindFactor);
      }
    }
    cfd::ConfidentialTransactionContext::SetAssetIssuance
              (&data,this,&outpoint,&issuance_data.amount,&issuance_data,&token_data.amount,
               &token_data,is_blind_asset,&local_ae8);
    cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_b28,&data.entropy);
    pcVar6 = cfd::capi::CreateString(&local_b28);
    paVar1 = &local_b28.field_2;
    work_entropy = pcVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b28._M_dataplus._M_p != paVar1) {
      operator_delete(local_b28._M_dataplus._M_p);
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_b28,&data.asset);
    pcVar7 = cfd::capi::CreateString(&local_b28);
    work_asset = pcVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b28._M_dataplus._M_p != paVar1) {
      operator_delete(local_b28._M_dataplus._M_p);
    }
    if (token_string == (char **)0x0) {
      *entropy = pcVar6;
      *asset_string = pcVar7;
    }
    else {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_b28,&data.token);
      pcVar8 = cfd::capi::CreateString(&local_b28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b28._M_dataplus._M_p != paVar1) {
        operator_delete(local_b28._M_dataplus._M_p);
      }
      *entropy = pcVar6;
      *asset_string = pcVar7;
      *token_string = pcVar8;
    }
    data.token._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
    if (data.token.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.token.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    data.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
    if (data.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.asset.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    data.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
    if ((void *)CONCAT71(data.entropy.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         data.entropy.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(data.entropy.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       data.entropy.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_));
    }
    if (local_ae8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_ae8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&token_data);
    cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&issuance_data);
    outpoint.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
    if (outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(outpoint.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
  issuance_data.address._0_8_ = &issuance_data.address.address_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&issuance_data,"Invalid handle state. tx is bitcoin.","");
  cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalStateError,(string *)&issuance_data);
  __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetIssueAsset(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    const char* contract_hash, int64_t asset_amount, const char* asset_address,
    const char* asset_locking_script, int64_t token_amount,
    const char* token_address, const char* token_locking_script,
    bool is_blind_asset, char** entropy, char** asset_string,
    char** token_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_entropy = nullptr;
  char* work_asset = nullptr;
  char* work_token = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (entropy == nullptr) {
      warn(CFD_LOG_SOURCE, "entropy is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null.");
    }
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (asset_string == nullptr) {
      warn(CFD_LOG_SOURCE, "asset_string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset_string is null.");
    }
    if ((token_amount > 0) && (token_string == nullptr)) {
      warn(CFD_LOG_SOURCE, "token_string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. token_string is null.");
    }
    if ((asset_address == nullptr) && (asset_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "asset address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset address and script is null.");
    }
    if ((token_amount > 0) && (token_address == nullptr) &&
        (token_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "token address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. token address and script is null.");
    }
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    cfd::IssuanceOutputParameter issuance_data =
        ConvertToIssuanceParameter(asset_address, asset_locking_script);
    issuance_data.amount = Amount(asset_amount);
    cfd::IssuanceOutputParameter token_data;
    if (token_amount > 0) {
      token_data =
          ConvertToIssuanceParameter(token_address, token_locking_script);
      token_data.amount = Amount(token_amount);
    }
    ByteData256 contract_hash_obj;
    if (!IsEmptyString(contract_hash)) {
      contract_hash_obj = ByteData256(contract_hash);
    }

    auto data = tx->SetAssetIssuance(
        outpoint, issuance_data.amount, issuance_data, token_data.amount,
        token_data, is_blind_asset, contract_hash_obj);

    work_entropy = CreateString(data.entropy.GetHex());
    work_asset = CreateString(data.asset.GetHex());
    if (token_string != nullptr) {
      work_token = CreateString(data.token.GetHex());
    }

    *entropy = work_entropy;
    *asset_string = work_asset;
    if (token_string != nullptr) *token_string = work_token;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_entropy, &work_asset, &work_token);
  return result;
}